

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::CommonCore(CommonCore *this,bool param_2)

{
  byte in_SIL;
  Core *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_ffffffffffffffc0;
  TriggerVariable *this_00;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 DisableQueue;
  BrokerBase *in_stack_ffffffffffffffd0;
  array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *this_01;
  id local_20;
  id local_18;
  byte local_9;
  
  DisableQueue = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  local_9 = in_SIL & 1;
  Core::Core(in_RDI);
  BrokerBase::BrokerBase(in_stack_ffffffffffffffd0,(bool)DisableQueue);
  in_RDI->_vptr_Core = (_func_int **)&PTR__CommonCore_00a59020;
  in_RDI[1]._vptr_Core = (_func_int **)&DAT_00a593b0;
  std::atomic<double>::atomic
            ((atomic<double> *)in_stack_ffffffffffffffc0,
             (double)CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      )));
  *(undefined4 *)&in_RDI[0x55]._vptr_Core = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 0x55));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffd0);
  std::
  map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::map((map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
         *)0x51e355);
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::SimpleQueue
            ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_ffffffffffffffc0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                   *)0x51e377);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x51e388);
  std::make_unique<helics::TimeoutMonitor>();
  *(undefined4 *)&in_RDI[0x7c]._vptr_Core = 0;
  std::atomic<short>::atomic
            ((atomic<short> *)in_stack_ffffffffffffffc0,
             CONCAT11(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe));
  *(undefined1 *)((long)&in_RDI[0x7c]._vptr_Core + 6) = 0;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::shared_guarded<>((shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                      *)in_stack_ffffffffffffffc0);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  DualStringMappedVector
            ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
              *)in_stack_ffffffffffffffc0);
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffffc0,
             CONCAT13(in_stack_ffffffffffffffbf,
                      CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  gmlc::libguarded::ordered_guarded<helics::HandleManager,_std::shared_mutex>::ordered_guarded<>
            (in_stack_ffffffffffffffc0);
  HandleManager::HandleManager(&in_stack_ffffffffffffffc0->m_obj);
  CLI::std::
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ::vector((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
            *)0x51e430);
  in_RDI[0x129]._vptr_Core = (_func_int **)0x0;
  this_01 = (array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *)
            (in_RDI + 0x12a);
  CLI::std::thread::id::id((id *)&local_18);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)this_01,local_18);
  std::atomic<helics::GlobalFederateId>::atomic
            ((atomic<helics::GlobalFederateId> *)in_stack_ffffffffffffffc0);
  std::
  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::map((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         *)0x51e486);
  std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffffc0,
             CONCAT13(in_stack_ffffffffffffffbf,
                      CONCAT12(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc)));
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffffc0);
  std::
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::deque((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           *)0x51e4be);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::vector((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            *)0x51e4d1);
  in_RDI[0x15d]._vptr_Core = (_func_int **)0x0;
  this_00 = (TriggerVariable *)(in_RDI + 0x15e);
  CLI::std::thread::id::id((id *)&local_20);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)this_00,local_20);
  std::atomic<helics::GlobalFederateId>::atomic((atomic<helics::GlobalFederateId> *)this_00);
  std::atomic<unsigned_short>::atomic
            ((atomic<unsigned_short> *)this_00,
             CONCAT11(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffbe));
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::array
            (this_01);
  gmlc::concurrency::TriggerVariable::TriggerVariable(this_00,(bool)in_stack_ffffffffffffffbf);
  CLI::std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)in_stack_ffffffffffffffbf);
  return;
}

Assistant:

CommonCore::CommonCore(bool /*arg*/) noexcept: timeoutMon(std::make_unique<TimeoutMonitor>()) {}